

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_raster.cpp
# Opt level: O3

void __thiscall
QRasterPlatformPixmap::fromImageReader
          (QRasterPlatformPixmap *this,QImageReader *imageReader,ImageConversionFlags flags)

{
  QImage sourceImage;
  bool bVar1;
  size_t in_RCX;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  _func_int **in_stack_ffffffffffffffa8;
  QImageData *in_stack_ffffffffffffffb8;
  undefined1 local_38 [16];
  QImageData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImageReader::read((QImageReader *)local_38,(int)imageReader,
                     (void *)CONCAT44(in_register_00000014,
                                      flags.super_QFlagsStorageHelper<Qt::ImageConversionFlag,_4>.
                                      super_QFlagsStorage<Qt::ImageConversionFlag>.i),in_RCX);
  bVar1 = QImage::isNull((QImage *)local_38);
  if (!bVar1) {
    QPaintDevice::QPaintDevice((QPaintDevice *)&stack0xffffffffffffffb0);
    local_28 = (QImageData *)0x0;
    sourceImage.super_QPaintDevice._8_8_ = &PTR__QImage_007d1ec8;
    sourceImage.super_QPaintDevice._vptr_QPaintDevice = in_stack_ffffffffffffffa8;
    sourceImage.d = in_stack_ffffffffffffffb8;
    createPixmapForImage
              (this,sourceImage,
               (QFlagsStorageHelper<Qt::ImageConversionFlag,_4>)
               SUB84((QImage *)&stack0xffffffffffffffb0,0));
    QImage::~QImage((QImage *)&stack0xffffffffffffffb0);
  }
  QImage::~QImage((QImage *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPlatformPixmap::fromImageReader(QImageReader *imageReader,
                                        Qt::ImageConversionFlags flags)
{
    Q_UNUSED(flags);
    QImage image = imageReader->read();
    if (image.isNull())
        return;

    createPixmapForImage(std::move(image), flags);
}